

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O2

void add_objsymbol(ObjectUnit *ou,Symbol *newsym)

{
  Symbol *pSVar1;
  char *__s1;
  int iVar2;
  unsigned_long uVar3;
  Symbol **ppSVar4;
  
  ppSVar4 = ou->objsyms;
  uVar3 = elf_hash(newsym->name);
  ppSVar4 = ppSVar4 + ((uint)uVar3 & 0x1f);
  while (pSVar1 = *ppSVar4, pSVar1 != (Symbol *)0x0) {
    __s1 = newsym->name;
    iVar2 = strcmp(__s1,pSVar1->name);
    if (iVar2 == 0) {
      ierror("add_objsymbol(): %s defined twice",__s1);
    }
    ppSVar4 = &pSVar1->obj_chain;
  }
  *ppSVar4 = newsym;
  return;
}

Assistant:

static void add_objsymbol(struct ObjectUnit *ou,struct Symbol *newsym)
/* Add a symbol to an object unit's symbol table. The symbol name
   must be unique within the object, otherwise an internal error
   will occur! */
{
  struct Symbol *sym;
  struct Symbol **chain = &ou->objsyms[elf_hash(newsym->name)%OBJSYMHTABSIZE];

  while (sym = *chain) {
    if (!strcmp(newsym->name,sym->name))
      ierror("add_objsymbol(): %s defined twice",newsym->name);
    chain = &sym->obj_chain;
  }
  *chain = newsym;
}